

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O1

void __thiscall Assimp::ASE::Dummy::Dummy(Dummy *this)

{
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"DUMMY","");
  BaseNode::BaseNode(&this->super_BaseNode,Dummy,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

Dummy() AI_NO_EXCEPT
    : BaseNode  (BaseNode::Dummy, "DUMMY") {
        // empty
    }